

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::fill<capnp::(anonymous_namespace)::Indent,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,Indent *rest,
          ArrayPtr<const_char> *rest_1)

{
  char *pcVar1;
  Branch *pBVar2;
  StringTree *pSVar3;
  Indent *first_00;
  ArrayPtr<const_char> *rest_00;
  ArrayPtr<const_char> *rest_local_1;
  Indent *rest_local;
  StringTree *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pcVar1 = String::begin(&this->text);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  pBVar2->index = (long)pos - (long)pcVar1;
  pSVar3 = mv<kj::StringTree>(first);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  operator=(&pBVar2->content,pSVar3);
  first_00 = fwd<capnp::(anonymous_namespace)::Indent>(rest);
  rest_00 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  fill<capnp::(anonymous_namespace)::Indent,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,first_00,rest_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}